

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O1

void __thiscall wasm::PostEmscripten::removeExports(PostEmscripten *this,Module *module)

{
  pointer puVar1;
  Global *pGVar2;
  pointer puVar3;
  Function *pFVar4;
  ElementSegment *pEVar5;
  pointer ppEVar6;
  pointer puVar7;
  DataSegment *pDVar8;
  char *__code;
  PassRunner *pPVar9;
  ulong uVar10;
  pointer puVar11;
  __node_base_ptr p_Var12;
  _Hash_node_base _Var13;
  const_iterator cVar14;
  undefined1 uVar15;
  undefined1 reuse;
  ulong in_RCX;
  ulong uVar16;
  _Hash_node_base *p_Var17;
  pointer ppEVar18;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar19;
  pointer puVar20;
  pointer puVar21;
  string_view sVar22;
  string_view sVar23;
  undefined1 auStack_1a8 [8];
  OffsetSearcher searcher;
  unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
  passiveOffsets;
  __node_base local_80 [2];
  Expression *local_70;
  pointer local_68;
  PostEmscripten *local_60;
  Module *local_58;
  _Hash_node_base local_50;
  Address UNKNOWN_OFFSET;
  vector<wasm::Address,_std::allocator<wasm::Address>_> segmentOffsets;
  
  UNKNOWN_OFFSET.addr = 0;
  segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50._M_nxt = (_Hash_node_base *)0xffffffff;
  searcher.offsets =
       (unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
        *)&passiveOffsets._M_h._M_rehash_policy._M_next_resize;
  passiveOffsets._M_h._M_buckets = (__buckets_ptr)0x1;
  passiveOffsets._M_h._M_bucket_count = 0;
  passiveOffsets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  passiveOffsets._M_h._M_element_count._0_4_ = 0x3f800000;
  passiveOffsets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  passiveOffsets._M_h._M_rehash_policy._4_4_ = 0;
  passiveOffsets._M_h._M_rehash_policy._M_next_resize = 0;
  local_60 = this;
  if (((module->features).features & 0x10) != 0) {
    auStack_1a8 = (undefined1  [8])0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.replacep = (Expression **)0x0
    ;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.fixed._M_elems[9].currp
         = (Expression **)0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.currModule =
         (Module *)&searcher.offsets;
    puVar19 = (module->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.currFunction =
         (Function *)module;
    if (puVar19 != puVar1) {
      do {
        pGVar2 = (puVar19->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
          Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                    ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_1a8,
                     &pGVar2->init);
        }
        puVar19 = puVar19 + 1;
      } while (puVar19 != puVar1);
    }
    puVar20 = (module->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar20 != puVar3) {
      do {
        pFVar4 = (puVar20->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar4->super_Importable).module + 8) == (char *)0x0) {
          searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
          super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pFVar4;
          Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                    ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_1a8,
                     &pFVar4->body);
          searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
          super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        puVar20 = puVar20 + 1;
      } while (puVar20 != puVar3);
    }
    puVar21 = (module->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_68 = (module->elementSegments).
               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_58 = module;
    if (puVar21 != local_68) {
      do {
        pEVar5 = (puVar21->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (*(char **)((long)&(pEVar5->table).super_IString + 8) != (char *)0x0) {
          Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                    ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_1a8,
                     &pEVar5->offset);
        }
        ppEVar6 = *(pointer *)
                   ((long)&(pEVar5->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                   + 8);
        for (ppEVar18 = *(pointer *)
                         &(pEVar5->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl; ppEVar18 != ppEVar6; ppEVar18 = ppEVar18 + 1) {
          local_70 = *ppEVar18;
          Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                    ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_1a8,
                     &local_70);
        }
        puVar21 = puVar21 + 1;
      } while (puVar21 != local_68);
    }
    module = local_58;
    puVar11 = (local_58->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (local_58->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar11 != puVar7) {
      do {
        pDVar8 = (puVar11->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar8->isPassive == false) {
          Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                    ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_1a8,
                     &pDVar8->offset);
        }
        puVar11 = puVar11 + 1;
      } while (puVar11 != puVar7);
    }
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.currFunction =
         (Function *)0x0;
    if (searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
        super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.fixed._M_elems[9].
        currp != (Expression **)0x0) {
      operator_delete(searcher.
                      super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
                      super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.fixed
                      ._M_elems[9].currp,
                      (long)searcher.
                            super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
                            super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack
                            .flexible.
                            super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)searcher.
                            super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
                            super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack
                            .fixed._M_elems[9].currp);
    }
  }
  puVar11 = (module->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((module->dataSegments).
      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar11) {
    uVar16 = 0;
    uVar10 = 1;
    do {
      in_RCX = uVar10;
      pDVar8 = puVar11[uVar16]._M_t.
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar8->isPassive == true) {
        __code = *(char **)((long)&(pDVar8->super_Named).name + 8);
        p_Var12 = std::
                  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_before_node
                            ((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)&searcher.offsets,
                             (ulong)__code % (ulong)passiveOffsets._M_h._M_buckets,
                             (key_type *)pDVar8,(__hash_code)__code);
        if (p_Var12 == (__node_base_ptr)0x0) {
          p_Var17 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var17 = p_Var12->_M_nxt;
        }
        if (p_Var17 == (_Hash_node_base *)0x0) {
          _Var13._M_nxt = local_50._M_nxt;
          if (segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>.
              _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
            p_Var17 = &local_50;
            goto LAB_0082ce4e;
          }
        }
        else {
          p_Var17 = p_Var17 + 3;
          if (segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>.
              _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
LAB_0082ce4e:
            std::vector<wasm::Address,std::allocator<wasm::Address>>::
            _M_realloc_insert<wasm::Address_const&>
                      ((vector<wasm::Address,std::allocator<wasm::Address>> *)&UNKNOWN_OFFSET,
                       (iterator)
                       segmentOffsets.
                       super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
                       super__Vector_impl_data._M_start,(Address *)p_Var17);
            goto LAB_0082ce56;
          }
          _Var13._M_nxt = p_Var17->_M_nxt;
        }
LAB_0082ce30:
        (segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
         super__Vector_impl_data._M_start)->addr = (address64_t)_Var13._M_nxt;
LAB_0082ce33:
        segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
        super__Vector_impl_data._M_start =
             segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      else if (pDVar8->offset->_id == 0xe) {
        auStack_1a8 = (undefined1  [8])Literal::getUnsigned((Literal *)(pDVar8->offset + 1));
        _Var13._M_nxt = (_Hash_node_base *)auStack_1a8;
        if (segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0082ce30;
        std::vector<wasm::Address,_std::allocator<wasm::Address>_>::_M_realloc_insert<wasm::Address>
                  ((vector<wasm::Address,_std::allocator<wasm::Address>_> *)&UNKNOWN_OFFSET,
                   (iterator)0x0,(Address *)auStack_1a8);
      }
      else {
        auStack_1a8 = (undefined1  [8])0x0;
        if (segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          (segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
           super__Vector_impl_data._M_start)->addr = 0;
          goto LAB_0082ce33;
        }
        std::vector<wasm::Address,_std::allocator<wasm::Address>_>::_M_realloc_insert<wasm::Address>
                  ((vector<wasm::Address,_std::allocator<wasm::Address>_> *)&UNKNOWN_OFFSET,
                   (iterator)0x0,(Address *)auStack_1a8);
      }
LAB_0082ce56:
      puVar11 = (module->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = in_RCX;
      uVar10 = (ulong)((int)in_RCX + 1);
    } while (in_RCX < (ulong)((long)(module->dataSegments).
                                    super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 3)
            );
  }
  uVar15 = (undefined1)in_RCX;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&searcher.offsets);
  pPVar9 = (local_60->super_Pass).runner;
  passiveOffsets._M_h._M_single_bucket = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&passiveOffsets._M_h._M_single_bucket,"post-emscripten-side-module","");
  cVar14 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(pPVar9->options).arguments._M_h,
                  (key_type *)&passiveOffsets._M_h._M_single_bucket);
  if (passiveOffsets._M_h._M_single_bucket != local_80) {
    operator_delete(passiveOffsets._M_h._M_single_bucket,
                    (ulong)((long)&(local_80[0]._M_nxt)->_M_nxt + 1));
  }
  if (cVar14.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    sVar22 = IString::interned((IString *)0xe,(string_view)ZEXT816(0xb92c91),(bool)uVar15);
    sVar23 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xb92ca0),(bool)uVar15);
    uVar15 = (char)sVar22._M_str;
    anon_unknown_0::removeData
              (module,(vector<wasm::Address,_std::allocator<wasm::Address>_> *)&UNKNOWN_OFFSET,
               (Name)sVar22,(Name)sVar23);
    sVar22 = IString::interned((IString *)0xe,(string_view)ZEXT816(0xb92c91),(bool)uVar15);
    Module::removeExport(module,(Name)sVar22);
    sVar22 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xb92ca0),(bool)uVar15);
    Module::removeExport(module,(Name)sVar22);
  }
  sVar22 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xb92cae),(bool)uVar15);
  reuse = sVar22._M_str._0_1_;
  sVar23 = IString::interned((IString *)0xc,(string_view)ZEXT816(0xb92cbc),(bool)uVar15);
  anon_unknown_0::removeData
            (module,(vector<wasm::Address,_std::allocator<wasm::Address>_> *)&UNKNOWN_OFFSET,
             (Name)sVar22,(Name)sVar23);
  sVar22 = IString::interned((IString *)0x13,(string_view)ZEXT816(0xb92cc9),(bool)reuse);
  uVar15 = sVar22._M_str._0_1_;
  sVar23 = IString::interned((IString *)0x12,(string_view)ZEXT816(0xb92cdd),(bool)reuse);
  anon_unknown_0::removeData
            (module,(vector<wasm::Address,_std::allocator<wasm::Address>_> *)&UNKNOWN_OFFSET,
             (Name)sVar22,(Name)sVar23);
  sVar22 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xb92cae),(bool)uVar15);
  Module::removeExport(module,(Name)sVar22);
  sVar22 = IString::interned((IString *)0xc,(string_view)ZEXT816(0xb92cbc),(bool)uVar15);
  Module::removeExport(module,(Name)sVar22);
  sVar22 = IString::interned((IString *)0x13,(string_view)ZEXT816(0xb92cc9),(bool)uVar15);
  Module::removeExport(module,(Name)sVar22);
  sVar22 = IString::interned((IString *)0x12,(string_view)ZEXT816(0xb92cdd),(bool)uVar15);
  Module::removeExport(module,(Name)sVar22);
  if (UNKNOWN_OFFSET.addr != 0) {
    operator_delete((void *)UNKNOWN_OFFSET.addr,-UNKNOWN_OFFSET.addr);
  }
  return;
}

Assistant:

void removeExports(Module& module) {
    std::vector<Address> segmentOffsets; // segment index => address offset
    calcSegmentOffsets(module, segmentOffsets);

    auto& options = getPassOptions();
    auto sideModule = options.hasArgument("post-emscripten-side-module");
    if (!sideModule) {
      // Side modules read EM_ASM data from the module based on these exports
      // so we need to keep them around in that case.
      removeData(module, segmentOffsets, "__start_em_asm", "__stop_em_asm");
      module.removeExport("__start_em_asm");
      module.removeExport("__stop_em_asm");
    }

    removeData(module, segmentOffsets, "__start_em_js", "__stop_em_js");
    removeData(
      module, segmentOffsets, "__start_em_lib_deps", "__stop_em_lib_deps");
    module.removeExport("__start_em_js");
    module.removeExport("__stop_em_js");
    module.removeExport("__start_em_lib_deps");
    module.removeExport("__stop_em_lib_deps");
  }